

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

mat<double,_3,_3> * __thiscall
linalg::inverse<double,3>
          (mat<double,_3,_3> *__return_storage_ptr__,linalg *this,mat<double,_3,_3> *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  
  adjugate<double>((mat<double,_3,_3> *)this);
  dVar4 = (*(double *)(this + 0x18) * *(double *)(this + 0x38) -
          *(double *)(this + 0x20) * *(double *)(this + 0x30)) * *(double *)(this + 0x10) +
          (*(double *)(this + 0x20) * *(double *)(this + 0x40) -
          *(double *)(this + 0x28) * *(double *)(this + 0x38)) * *(double *)this +
          (*(double *)(this + 0x28) * *(double *)(this + 0x30) -
          *(double *)(this + 0x40) * *(double *)(this + 0x18)) * *(double *)(this + 8);
  auVar5._8_8_ = dVar4;
  auVar5._0_8_ = dVar4;
  auVar5 = divpd(local_68,auVar5);
  (__return_storage_ptr__->x).x = (double)auVar5._0_8_;
  (__return_storage_ptr__->x).y = (double)auVar5._8_8_;
  auVar1._8_8_ = dVar4;
  auVar1._0_8_ = dVar4;
  auVar5 = divpd(local_58,auVar1);
  *(undefined1 (*) [16])&(__return_storage_ptr__->x).z = auVar5;
  auVar2._8_8_ = dVar4;
  auVar2._0_8_ = dVar4;
  auVar5 = divpd(local_48,auVar2);
  (__return_storage_ptr__->y).y = (double)auVar5._0_8_;
  (__return_storage_ptr__->y).z = (double)auVar5._8_8_;
  auVar3._8_8_ = dVar4;
  auVar3._0_8_ = dVar4;
  auVar5 = divpd(local_38,auVar3);
  (__return_storage_ptr__->z).x = (double)auVar5._0_8_;
  (__return_storage_ptr__->z).y = (double)auVar5._8_8_;
  (__return_storage_ptr__->z).z = local_28 / dVar4;
  return __return_storage_ptr__;
}

Assistant:

constexpr mat<T,N,N> inverse(const mat<T,N,N> & a) { return adjugate(a)/determinant(a); }